

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job.c
# Opt level: O0

void set_bounce(parse_t *ps,char *timespec)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char unit;
  char *unit_ptr;
  int interval;
  int l;
  char *timespec_local;
  parse_t *ps_local;
  
  _interval = timespec;
  timespec_local = (char *)ps;
  sVar3 = strlen(timespec);
  unit_ptr._4_4_ = (int)sVar3;
  cVar1 = _interval[unit_ptr._4_4_ + -1];
  _interval[unit_ptr._4_4_ + -1] = '\0';
  iVar2 = __isoc99_sscanf(_interval,"%u",&unit_ptr);
  if (iVar2 == 1) {
    switch(cVar1) {
    case 'd':
      unit_ptr._0_4_ = (int)unit_ptr * 0x15180;
      break;
    default:
      utstring_printf(*(UT_string **)(timespec_local + 8),"invalid time unit in \'bounce every\'");
      timespec_local[4] = -1;
      timespec_local[5] = -1;
      timespec_local[6] = -1;
      timespec_local[7] = -1;
      return;
    case 'h':
      unit_ptr._0_4_ = (int)unit_ptr * 0xe10;
      break;
    case 'm':
      unit_ptr._0_4_ = (int)unit_ptr * 0x3c;
      break;
    case 's':
    }
    *(int *)(*(long *)(timespec_local + 0x10) + 400) = (int)unit_ptr;
  }
  else {
    utstring_printf(*(UT_string **)(timespec_local + 8),"invalid time interval in \'bounce every\'")
    ;
    timespec_local[4] = -1;
    timespec_local[5] = -1;
    timespec_local[6] = -1;
    timespec_local[7] = -1;
  }
  return;
}

Assistant:

void set_bounce(parse_t *ps, char *timespec) { 
  int l = strlen(timespec), interval;
  char *unit_ptr = &timespec[l-1];
  char unit = *unit_ptr;
  *unit_ptr = '\0';
  if (sscanf(timespec, "%u", &interval) != 1) {
    utstring_printf(ps->em, "invalid time interval in 'bounce every'");
    ps->rc = -1;
    return;
  }

  switch (unit) {
    case 's': break;
    case 'm': interval *= 60;       break;
    case 'h': interval *= 60*60;    break;
    case 'd': interval *= 60*60*24; break;
    default: 
      utstring_printf(ps->em, "invalid time unit in 'bounce every'");
      ps->rc = -1;
      return;
  }

  ps->job->bounce_interval = interval;
}